

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

void moira::sprintd(char **s,u64 value)

{
  int digits;
  
  digits = decDigits(value);
  sprintd(s,value,digits);
  return;
}

Assistant:

static void sprintd(char *&s, u64 value)
{
    sprintd(s, value, decDigits(value));
}